

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UserInterface.cpp
# Opt level: O3

void __thiscall DialogPrompt::DialogPrompt(DialogPrompt *this)

{
  Vector2f local_38;
  
  (this->super_UIComponent).super_Drawable._vptr_Drawable = (_func_int **)&PTR__Drawable_001d19f0;
  sf::Transformable::Transformable(&(this->super_UIComponent).super_Transformable);
  (this->super_UIComponent).super_Transformable.field_0xa9 = 1;
  (this->super_UIComponent).super_Drawable._vptr_Drawable =
       (_func_int **)&PTR__DialogPrompt_001d2280;
  (this->super_UIComponent).super_Transformable._vptr_Transformable =
       (_func_int **)&PTR__DialogPrompt_001d22b8;
  sf::Text::Text(&this->text);
  local_38.x = 0.0;
  local_38.y = 0.0;
  sf::RectangleShape::RectangleShape(&this->background,&local_38);
  (this->optionChecks).super__Vector_base<CheckBox,_std::allocator<CheckBox>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->optionChecks).super__Vector_base<CheckBox,_std::allocator<CheckBox>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->optionFields).super__Vector_base<TextField,_std::allocator<TextField>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->optionFields).super__Vector_base<TextField,_std::allocator<TextField>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->optionButtons).super__Vector_base<TextButton,_std::allocator<TextButton>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->optionFields).super__Vector_base<TextField,_std::allocator<TextField>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->optionButtons).super__Vector_base<TextButton,_std::allocator<TextButton>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->optionButtons).super__Vector_base<TextButton,_std::allocator<TextButton>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->optionChecks).super__Vector_base<CheckBox,_std::allocator<CheckBox>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (UserInterface::_dialogPrompts.
      super__Vector_base<DialogPrompt_*,_std::allocator<DialogPrompt_*>_>._M_impl.
      super__Vector_impl_data._M_finish ==
      UserInterface::_dialogPrompts.
      super__Vector_base<DialogPrompt_*,_std::allocator<DialogPrompt_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    local_38 = (Vector2f)this;
    std::vector<DialogPrompt*,std::allocator<DialogPrompt*>>::_M_realloc_insert<DialogPrompt*>
              ((vector<DialogPrompt*,std::allocator<DialogPrompt*>> *)&UserInterface::_dialogPrompts
               ,(iterator)
                UserInterface::_dialogPrompts.
                super__Vector_base<DialogPrompt_*,_std::allocator<DialogPrompt_*>_>._M_impl.
                super__Vector_impl_data._M_finish,(DialogPrompt **)&local_38);
  }
  else {
    *UserInterface::_dialogPrompts.
     super__Vector_base<DialogPrompt_*,_std::allocator<DialogPrompt_*>_>._M_impl.
     super__Vector_impl_data._M_finish = this;
    UserInterface::_dialogPrompts.
    super__Vector_base<DialogPrompt_*,_std::allocator<DialogPrompt_*>_>._M_impl.
    super__Vector_impl_data._M_finish =
         UserInterface::_dialogPrompts.
         super__Vector_base<DialogPrompt_*,_std::allocator<DialogPrompt_*>_>._M_impl.
         super__Vector_impl_data._M_finish + 1;
  }
  return;
}

Assistant:

DialogPrompt::DialogPrompt() {
    UserInterface::_dialogPrompts.push_back(this);
}